

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Type(RecyclableObjectDisplay *this)

{
  bool bVar1;
  TypeId TVar2;
  BOOL BVar3;
  int iVar4;
  ThreadContext *this_00;
  DebugManager *pDVar5;
  JavascriptFunction *this_01;
  FunctionProxy *pFVar6;
  undefined4 extraout_var;
  ParseableFunctionInfo *local_60;
  char16 *pDisplayName;
  ParseableFunctionInfo *pFuncBody;
  JavascriptFunction *pfunction;
  Var pvStack_30;
  TypeId typeId;
  Var value;
  StringBuilder<Memory::ArenaAllocator> *builder;
  RecyclableObject *obj;
  LPCWSTR typeStr;
  RecyclableObjectDisplay *this_local;
  
  typeStr = (LPCWSTR)this;
  bVar1 = TaggedInt::Is(this->instance);
  if ((bVar1) || (bVar1 = JavascriptNumber::Is(this->instance), bVar1)) {
    obj = (RecyclableObject *)0x189393c;
  }
  else {
    builder = (StringBuilder<Memory::ArenaAllocator> *)VarTo<Js::RecyclableObject>(this->instance);
    this_00 = ScriptContext::GetThreadContext(this->scriptContext);
    pDVar5 = ThreadContext::GetDebugManager(this_00);
    value = pDVar5->pCurrentInterpreterLocation->stringBuilder;
    StringBuilder<Memory::ArenaAllocator>::Reset((StringBuilder<Memory::ArenaAllocator> *)value);
    pvStack_30 = (Var)0x0;
    TVar2 = RecyclableObject::GetTypeId((RecyclableObject *)builder);
    if ((TVar2 == TypeIds_Object) &&
       (BVar3 = GetPropertyWithScriptEnter
                          ((RecyclableObject *)builder,(RecyclableObject *)builder,0x67,
                           &stack0xffffffffffffffd0,this->scriptContext), BVar3 != 0)) {
      StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>
                ((StringBuilder<Memory::ArenaAllocator> *)value,(char16 (*) [7])0x198fee2);
      bVar1 = VarIs<Js::JavascriptFunction>(pvStack_30);
      if (bVar1) {
        this_01 = VarTo<Js::JavascriptFunction>(pvStack_30);
        pFVar6 = JavascriptFunction::GetFunctionProxy(this_01);
        if (pFVar6 == (FunctionProxy *)0x0) {
          local_60 = (ParseableFunctionInfo *)0x0;
        }
        else {
          pFVar6 = JavascriptFunction::GetFunctionProxy(this_01);
          local_60 = FunctionProxy::EnsureDeserialized(pFVar6);
        }
        if (local_60 != (ParseableFunctionInfo *)0x0) {
          iVar4 = (*(local_60->super_FunctionProxy).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
          if ((char16 *)CONCAT44(extraout_var,iVar4) != (char16 *)0x0) {
            StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
                      ((StringBuilder<Memory::ArenaAllocator> *)value,(char16 (*) [4])L", (");
            StringBuilder<Memory::ArenaAllocator>::AppendSz
                      ((StringBuilder<Memory::ArenaAllocator> *)value,
                       (char16 *)CONCAT44(extraout_var,iVar4));
            StringBuilder<Memory::ArenaAllocator>::Append
                      ((StringBuilder<Memory::ArenaAllocator> *)value,L')');
          }
        }
      }
      obj = (RecyclableObject *)
            StringBuilder<Memory::ArenaAllocator>::Detach
                      ((StringBuilder<Memory::ArenaAllocator> *)value);
    }
    else {
      iVar4 = (*builder->alloc[5].
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.recoverMemoryFunc)(builder,value,this->scriptContext);
      if (iVar4 == 0) {
        obj = (RecyclableObject *)0x1866d80;
      }
      else {
        obj = (RecyclableObject *)
              StringBuilder<Memory::ArenaAllocator>::Detach
                        ((StringBuilder<Memory::ArenaAllocator> *)value);
      }
    }
  }
  return (LPCWSTR)obj;
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Type()
    {
        LPCWSTR typeStr;

        if(Js::TaggedInt::Is(instance) || Js::JavascriptNumber::Is(instance))
        {
            typeStr = _u("Number");
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            // For the RecyclableObject try to find out the constructor, which will be shown as type for the object.
            // This case is to handle the user defined function, built in objects have dedicated classes to handle.

            Var value = nullptr;
            TypeId typeId = obj->GetTypeId();
            if (typeId == TypeIds_Object && GetPropertyWithScriptEnter(obj, obj, PropertyIds::constructor, &value, scriptContext))
            {
                builder->AppendCppLiteral(_u("Object"));
                if (Js::VarIs<Js::JavascriptFunction>(value))
                {
                    Js::JavascriptFunction *pfunction = Js::VarTo<Js::JavascriptFunction>(value);
                    // For an odd chance that the constructor wasn't called to create the object.
                    Js::ParseableFunctionInfo *pFuncBody = pfunction->GetFunctionProxy() != nullptr ? pfunction->GetFunctionProxy()->EnsureDeserialized() : nullptr;
                    if (pFuncBody)
                    {
                        const char16* pDisplayName = pFuncBody->GetDisplayName();
                        if (pDisplayName)
                        {
                            builder->AppendCppLiteral(_u(", ("));
                            builder->AppendSz(pDisplayName);
                            builder->Append(_u(')'));
                        }
                    }
                }
                typeStr = builder->Detach();
            }
            else if (obj->GetDiagTypeString(builder, scriptContext))
            {
                typeStr = builder->Detach();
            }
            else
            {
                typeStr = _u("Undefined");
            }
        }

        return typeStr;
    }